

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O3

const_iterator __thiscall ser::MetainfoSet::checkKeyExists(MetainfoSet *this,string *key)

{
  const_iterator cVar1;
  ostream *poVar2;
  SerializationException *this_00;
  SerializationException exception;
  ostringstream ss;
  undefined1 *local_1d0;
  undefined1 local_1c0 [16];
  undefined **local_1b0;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  ostringstream local_188 [376];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    return (const_iterator)cVar1._M_node;
  }
  local_1a8._M_p = (pointer)&local_198;
  local_1b0 = &PTR__SerializationException_001348f0;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Error: Requested key ",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,(key->_M_dataplus)._M_p,key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not in set\n",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1a8);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)&local_1b0);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

std::map<std::string, boost::any>::const_iterator MetainfoSet::checkKeyExists(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = data_.find(key);
    if (iter == data_.end())
    {
        SerializationException exception;
        std::ostringstream ss;
        ss << "Error: Requested key " << key << " is not in set\n";
        exception.Init(ss.str());
        throw exception;
    }
    return iter;
}